

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall
QPlainTextDocumentLayout::documentChanged
          (QPlainTextDocumentLayout *this,int from,int charsRemoved,int charsAdded)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QTextBlock *this_00;
  int iVar5;
  bool bVar6;
  long in_FS_OFFSET;
  qreal qVar7;
  ulong in_XMM1_Qa;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QTextBlock local_88;
  undefined8 local_78;
  double dStack_70;
  QTextBlock local_68;
  QTextDocumentPrivate *local_58;
  undefined1 *puStack_50;
  QTextDocumentPrivate *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  QAbstractTextDocumentLayout::document();
  iVar3 = QTextDocument::blockCount();
  local_48 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlock((int)&local_48);
  local_58 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlock((int)&local_58);
  if (((local_48 == local_58) && ((int)puStack_40 == (int)puStack_50)) &&
     (iVar3 == *(int *)(lVar1 + 0xac))) {
    local_68.p = local_48;
    local_68._12_4_ = 0xaaaaaaaa;
    local_68.n = (int)puStack_40;
    cVar2 = QTextBlock::isValid();
    if ((cVar2 != '\0') && (iVar4 = QTextBlock::length(), iVar4 != 0)) {
      local_78 = 0xffffffffffffffff;
      dStack_70 = -NAN;
      local_88.p = (QTextDocumentPrivate *)0xffffffffffffffff;
      local_88._8_8_ = 0xffffffffffffffff;
      (**(code **)(*(long *)this + 0x88))(&local_88,this,&local_68);
      layoutBlock(this,&local_68);
      local_98 = 0xffffffff;
      uStack_94 = 0xffffffff;
      uStack_90 = 0xffffffff;
      uStack_8c = 0xffffffff;
      local_a8 = 0xffffffff;
      uStack_a4 = 0xffffffff;
      uStack_a0 = 0xffffffff;
      uStack_9c = 0xffffffff;
      (**(code **)(*(long *)this + 0x88))(&local_a8,this,&local_68);
      if (((double)CONCAT44(uStack_8c,uStack_90) == dStack_70) &&
         (!NAN((double)CONCAT44(uStack_8c,uStack_90)) && !NAN(dStack_70))) {
        if (*(char *)(lVar1 + 0xb8) == '\0') {
          QAbstractTextDocumentLayout::updateBlock((QTextBlock *)this);
        }
        goto LAB_00494491;
      }
    }
    bVar6 = false;
  }
  else {
    local_88.p = local_48;
    local_88._12_4_ = 0xaaaaaaaa;
    local_88.n = (int)puStack_40;
    bVar6 = false;
    do {
      QTextBlock::clearLayout();
      cVar2 = QTextBlock::isVisible();
      iVar4 = QTextBlock::lineCount();
      if (cVar2 == '\0') {
        if (0 < iVar4) goto LAB_004942a8;
      }
      else if (iVar4 == 0) {
LAB_004942a8:
        QTextBlock::isVisible();
        QTextBlock::setLineCount((int)&local_88);
        bVar6 = true;
      }
      if (local_88.p == local_58) {
        if (local_88.n == (int)puStack_50) break;
      }
      QTextBlock::next();
      local_88.p = (QTextDocumentPrivate *)CONCAT44(uStack_a4,local_a8);
      local_88.n = uStack_a0;
      cVar2 = QTextBlock::isValid();
    } while (cVar2 != '\0');
  }
  if (iVar3 != *(int *)(lVar1 + 0xac) || bVar6) {
    iVar4 = QTextBlock::blockNumber();
    iVar5 = iVar3 - *(int *)(lVar1 + 0xac);
    if (iVar4 - iVar5 < *(int *)(lVar1 + 0xa8)) {
      *(int *)(lVar1 + 0xa8) = *(int *)(lVar1 + 0xa8) + iVar5;
    }
    *(int *)(lVar1 + 0xac) = iVar3;
    if (iVar3 == 1) {
      this_00 = &local_88;
      QTextDocument::firstBlock();
      qVar7 = blockWidth((QPlainTextDocumentLayout *)this_00,&local_88);
      *(qreal *)(lVar1 + 0xa0) = qVar7;
    }
    if (*(char *)(lVar1 + 0xb9) == '\0') {
      local_88.p = (QTextDocumentPrivate *)(**(code **)(*(long *)this + 0x78))(this);
      local_88._8_8_ = in_XMM1_Qa;
      QAbstractTextDocumentLayout::documentSizeChanged((QSizeF *)this);
    }
    if (iVar4 == iVar3 + -1 && iVar5 == 1) {
      if (*(char *)(lVar1 + 0xb8) == '\0') {
        local_88.p = local_48;
        local_88._12_4_ = 0xaaaaaaaa;
        local_88.n = (int)puStack_40;
        QAbstractTextDocumentLayout::updateBlock((QTextBlock *)this);
        if (local_88.p == local_58) {
          if (local_88.n == (int)puStack_50) goto LAB_00494491;
        }
        do {
          do {
            QTextBlock::next();
            local_88.p = (QTextDocumentPrivate *)CONCAT44(uStack_a4,local_a8);
            local_88.n = uStack_a0;
            QAbstractTextDocumentLayout::updateBlock((QTextBlock *)this);
          } while (local_88.p != local_58);
        } while (local_88.n != (int)puStack_50);
      }
      goto LAB_00494491;
    }
  }
  if (*(char *)(lVar1 + 0xb8) == '\0') {
    local_88._8_8_ = QTextDocument::documentMargin();
    local_88._8_8_ = local_88._8_8_ ^ (ulong)DAT_006605b0;
    local_88.p = (QTextDocumentPrivate *)0x0;
    local_78 = 0x41cdcd6500000000;
    dStack_70 = 1000000000.0;
    QAbstractTextDocumentLayout::update((QRectF *)this);
  }
LAB_00494491:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextDocumentLayout::documentChanged(int from, int charsRemoved, int charsAdded)
{
    Q_D(QPlainTextDocumentLayout);
    QTextDocument *doc = document();
    int newBlockCount = doc->blockCount();
    int charsChanged = charsRemoved + charsAdded;

    QTextBlock changeStartBlock = doc->findBlock(from);
    QTextBlock changeEndBlock = doc->findBlock(qMax(0, from + charsChanged - 1));
    bool blockVisibilityChanged = false;

    if (changeStartBlock == changeEndBlock && newBlockCount == d->blockCount) {
        QTextBlock block = changeStartBlock;
        if (block.isValid() && block.length()) {
            QRectF oldBr = blockBoundingRect(block);
            layoutBlock(block);
            QRectF newBr = blockBoundingRect(block);
            if (newBr.height() == oldBr.height()) {
                if (!d->blockUpdate)
                    emit updateBlock(block);
                return;
            }
        }
    } else {
        QTextBlock block = changeStartBlock;
        do {
            block.clearLayout();
            if (block.isVisible()
                    ? (block.lineCount() == 0)
                    : (block.lineCount() > 0)) {
                blockVisibilityChanged = true;
                block.setLineCount(block.isVisible() ? 1 : 0);
            }
            if (block == changeEndBlock)
                break;
            block = block.next();
        } while(block.isValid());
    }

    if (newBlockCount != d->blockCount || blockVisibilityChanged) {
        int changeEnd = changeEndBlock.blockNumber();
        int blockDiff = newBlockCount - d->blockCount;
        int oldChangeEnd = changeEnd - blockDiff;

        if (d->maximumWidthBlockNumber > oldChangeEnd)
            d->maximumWidthBlockNumber += blockDiff;

        d->blockCount = newBlockCount;
        if (d->blockCount == 1)
            d->maximumWidth = blockWidth(doc->firstBlock());

        if (!d->blockDocumentSizeChanged)
            emit documentSizeChanged(documentSize());

        if (blockDiff == 1 && changeEnd == newBlockCount -1 ) {
            if (!d->blockUpdate) {
                QTextBlock b = changeStartBlock;
                for(;;) {
                    emit updateBlock(b);
                    if (b == changeEndBlock)
                        break;
                    b = b.next();
                }
            }
            return;
        }
    }

    if (!d->blockUpdate)
        emit update(QRectF(0., -doc->documentMargin(), 1000000000., 1000000000.)); // optimization potential
}